

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_impl.cpp
# Opt level: O0

Element __thiscall ui::anon_unknown_0::WiFiImpl::Render(WiFiImpl *this)

{
  bool bVar1;
  pointer pRVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  Element EVar4;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  WiFiImpl *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  this_local = this;
  if ((*(byte *)(in_RSI + 0x249) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Feature not supported",&local_71);
    ftxui::text((ftxui *)this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    while( true ) {
      pRVar2 = std::
               unique_ptr<ftxui::ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator->((unique_ptr<ftxui::ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             *)(in_RSI + 0x270));
      bVar1 = ftxui::
              ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::HasPending(pRVar2);
      if (!bVar1) break;
      pRVar2 = std::
               unique_ptr<ftxui::ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator->((unique_ptr<ftxui::ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             *)(in_RSI + 0x270));
      ftxui::
      ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::Receive(pRVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RSI + 0x230));
    }
    if (*(int *)(in_RSI + 0x2c) == 0) {
      EVar4 = RenderMain(this);
      _Var3 = EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    else if (*(int *)(in_RSI + 0x2c) == 1) {
      EVar4 = RenderConnect(this);
      _Var3 = EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Not implemented",&local_39);
      ftxui::text((ftxui *)this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      _Var3._M_pi = extraout_RDX;
    }
  }
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    if (wifiCompatiblity) {
      while (wifi_list_receiver_->HasPending())
        wifi_list_receiver_->Receive(&wifi_list_);

      if (activity == ActivityMain)
        return RenderMain();

      if (activity == ActivityConnect)
        return RenderConnect();

      return text("Not implemented");
    } else {
      return text("Feature not supported");
    }
  }